

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

void __thiscall KeyPair::KeyPair(KeyPair *this,CKey *key,uint256 *merkle_root)

{
  long lVar1;
  _Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false> keypair;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vch;
  base_blob<256U> bStack_c8;
  uint256 tweak;
  uchar pubkey_bytes [32];
  secp256k1_xonly_pubkey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_keypair)._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_96UL> *)0x0;
  MakeKeyPairData(this);
  keypair._M_head_impl =
       (this->m_keypair)._M_t.
       super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
       .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl;
  iVar3 = secp256k1_keypair_create
                    (secp256k1_context_sign,(secp256k1_keypair *)keypair._M_head_impl,
                     ((key->keydata)._M_t.
                      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)
                     ->_M_elems);
  if (merkle_root != (uint256 *)0x0 && iVar3 != 0) {
    iVar3 = secp256k1_keypair_xonly_pub
                      (secp256k1_context_sign,&pubkey,(int *)0x0,
                       (secp256k1_keypair *)keypair._M_head_impl);
    if (iVar3 == 0) {
      __assert_fail("secp256k1_keypair_xonly_pub(secp256k1_context_sign, &pubkey, nullptr, keypair)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x1a2,"KeyPair::KeyPair(const CKey &, const uint256 *)");
    }
    iVar3 = secp256k1_xonly_pubkey_serialize(secp256k1_context_sign,pubkey_bytes,&pubkey);
    if (iVar3 == 0) {
      __assert_fail("secp256k1_xonly_pubkey_serialize(secp256k1_context_sign, pubkey_bytes, &pubkey)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x1a3,"KeyPair::KeyPair(const CKey &, const uint256 *)");
    }
    vch.m_size = 0x20;
    vch.m_data = pubkey_bytes;
    base_blob<256U>::base_blob(&bStack_c8,vch);
    bVar2 = base_blob<256U>::IsNull(&merkle_root->super_base_blob<256U>);
    if (bVar2) {
      merkle_root = (uint256 *)0x0;
    }
    XOnlyPubKey::ComputeTapTweakHash(&tweak,(XOnlyPubKey *)&bStack_c8,merkle_root);
    iVar3 = secp256k1_keypair_xonly_tweak_add
                      (secp256k1_context_static,(secp256k1_keypair *)keypair._M_head_impl,
                       (uchar *)&tweak);
  }
  if (iVar3 == 0) {
    ClearKeyPairData(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

KeyPair::KeyPair(const CKey& key, const uint256* merkle_root)
{
    static_assert(std::tuple_size<KeyType>() == sizeof(secp256k1_keypair));
    MakeKeyPairData();
    auto keypair = reinterpret_cast<secp256k1_keypair*>(m_keypair->data());
    bool success = secp256k1_keypair_create(secp256k1_context_sign, keypair, UCharCast(key.data()));
    if (success && merkle_root) {
        secp256k1_xonly_pubkey pubkey;
        unsigned char pubkey_bytes[32];
        assert(secp256k1_keypair_xonly_pub(secp256k1_context_sign, &pubkey, nullptr, keypair));
        assert(secp256k1_xonly_pubkey_serialize(secp256k1_context_sign, pubkey_bytes, &pubkey));
        uint256 tweak = XOnlyPubKey(pubkey_bytes).ComputeTapTweakHash(merkle_root->IsNull() ? nullptr : merkle_root);
        success = secp256k1_keypair_xonly_tweak_add(secp256k1_context_static, keypair, tweak.data());
    }
    if (!success) ClearKeyPairData();
}